

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::NeuralNetworkRegressor::_InternalParse
          (NeuralNetworkRegressor *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  NeuralNetworkLayer *msg;
  NeuralNetworkPreprocessing *msg_00;
  uint64_t uVar2;
  NetworkUpdateParameters *msg_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar3;
  uint32_t tag;
  char *local_50;
  NeuralNetworkRegressor *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_50 = ptr;
  local_48 = this;
LAB_00221784:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) {
      return local_50;
    }
    local_50 = google::protobuf::internal::ReadTag(local_50,&local_3c,0);
    tag_00 = local_3c;
    cVar3 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar3 == '\n') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          msg = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          (&this->layers_);
          local_50 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\n'));
        goto LAB_00221784;
      }
      break;
    case 2:
      if (cVar3 == '\x12') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          msg_00 = google::protobuf::
                   RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::Add
                             (&this->preprocessing_);
          local_50 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg_00->super_MessageLite,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\x12'));
        goto LAB_00221784;
      }
      break;
    case 5:
      if (cVar3 == '(') {
        uVar2 = google::protobuf::internal::ReadVarint64(&local_50);
        if (local_50 == (char *)0x0) {
          return (char *)0x0;
        }
        local_48->arrayinputshapemapping_ = (int)uVar2;
        goto LAB_00221784;
      }
      break;
    case 6:
      if (cVar3 == '0') {
        uVar2 = google::protobuf::internal::ReadVarint64(&local_50);
        if (local_50 == (char *)0x0) {
          return (char *)0x0;
        }
        local_48->imageinputshapemapping_ = (int)uVar2;
        goto LAB_00221784;
      }
      break;
    case 10:
      if (cVar3 != 'R') break;
      msg_01 = _internal_mutable_updateparams(local_48);
      local_50 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg_01->super_MessageLite,local_50);
      goto LAB_00221900;
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return local_50;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_50 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_50,ctx);
LAB_00221900:
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* NeuralNetworkRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_layers(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_preprocessing(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 40)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_arrayinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_imageinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkImageShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_updateparams(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}